

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parquet.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetOptionsSerialization::Serialize
          (ParquetOptionsSerialization *this,Serializer *serializer)

{
  shared_ptr<duckdb::ParquetEncryptionConfig,_true> local_28;
  
  Serializer::WritePropertyWithDefault<bool>(serializer,100,"binary_as_string",(bool *)this);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x65,"file_row_number",&(this->parquet_options).file_row_number);
  Serializer::WriteProperty<duckdb::MultiFileOptions>
            (serializer,0x66,"file_options",&this->file_options);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ParquetColumnDefinition,true>>
            (serializer,0x67,"schema",&(this->parquet_options).schema);
  local_28.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_28.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Serializer::WritePropertyWithDefault<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>
            (serializer,0x68,"encryption_config",&(this->parquet_options).encryption_config,
             &local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.internal.
              super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_28.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           CONCAT71(local_28.internal.
                    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._1_7_,1);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0x69,"debug_use_openssl",&(this->parquet_options).debug_use_openssl,
             (bool *)&local_28);
  local_28.internal.super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x6a,"explicit_cardinality",&(this->parquet_options).explicit_cardinality,
             (unsigned_long *)&local_28);
  return;
}

Assistant:

void ParquetOptionsSerialization::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<bool>(100, "binary_as_string", parquet_options.binary_as_string);
	serializer.WritePropertyWithDefault<bool>(101, "file_row_number", parquet_options.file_row_number);
	serializer.WriteProperty<MultiFileOptions>(102, "file_options", file_options);
	serializer.WritePropertyWithDefault<vector<ParquetColumnDefinition>>(103, "schema", parquet_options.schema);
	serializer.WritePropertyWithDefault<shared_ptr<ParquetEncryptionConfig>>(104, "encryption_config", parquet_options.encryption_config, nullptr);
	serializer.WritePropertyWithDefault<bool>(105, "debug_use_openssl", parquet_options.debug_use_openssl, true);
	serializer.WritePropertyWithDefault<idx_t>(106, "explicit_cardinality", parquet_options.explicit_cardinality, 0);
}